

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  float fVar1;
  float fVar2;
  ImVec2 *local_28;
  ImVec2 local_20;
  float local_18;
  int local_14;
  float a;
  int i;
  ImDrawListSharedData *this_local;
  
  _a = this;
  ImVec2::ImVec2(&this->TexUvWhitePixel);
  ImVec4::ImVec4(&this->ClipRectFullscreen);
  local_28 = this->ArcFastVtx;
  do {
    ImVec2::ImVec2(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != (ImVec2 *)&this->ArcFastRadiusCutoff);
  memset(this,0,0x200);
  for (local_14 = 0; local_14 < 0x30; local_14 = local_14 + 1) {
    local_18 = ((float)local_14 * 2.0 * 3.1415927) / 48.0;
    fVar1 = cosf(local_18);
    fVar2 = sinf(local_18);
    ImVec2::ImVec2(&local_20,fVar1,fVar2);
    this->ArcFastVtx[local_14] = local_20;
  }
  fVar1 = this->CircleSegmentMaxError;
  fVar2 = ImMax<float>(48.0,3.1415927);
  fVar2 = cosf(3.1415927 / fVar2);
  this->ArcFastRadiusCutoff = fVar1 / (1.0 - fVar2);
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    memset(this, 0, sizeof(*this));
    for (int i = 0; i < IM_ARRAYSIZE(ArcFastVtx); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(ArcFastVtx);
        ArcFastVtx[i] = ImVec2(ImCos(a), ImSin(a));
    }
    ArcFastRadiusCutoff = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC_R(IM_DRAWLIST_ARCFAST_SAMPLE_MAX, CircleSegmentMaxError);
}